

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.cpp
# Opt level: O0

string * __thiscall
ast::InitStmt::toString_abi_cxx11_(string *__return_storage_ptr__,InitStmt *this)

{
  ostream *this_00;
  ostringstream local_190 [8];
  ostringstream msg;
  InitStmt *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  std::operator<<((ostream *)local_190,"init ");
  ast::operator<<((ostream *)local_190,this->variable);
  std::operator<<((ostream *)local_190," = ");
  this_00 = ast::operator<<((ostream *)local_190,this->value);
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return __return_storage_ptr__;
}

Assistant:

std::string ast::InitStmt::toString() const
{
    std::ostringstream msg;
    msg << "init ";
    msg << variable;
    msg << " = ";
    msg << value << std::endl;
    return msg.str();
}